

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_runtime.cc
# Opt level: O2

void __thiscall tvm::runtime::GraphRuntime::LoadParams(GraphRuntime *this,Stream *strm)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  undefined4 extraout_var_00;
  long lVar4;
  uint64_t uVar5;
  int in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  LogCheckError _check_err;
  uint32_t eid;
  Stream *local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  uint64_t sz;
  uint64_t header;
  uint64_t reserved;
  NDArray temp;
  
  local_1f0 = strm;
  iVar2 = (**strm->_vptr_Stream)(strm,&header,8);
  if (CONCAT44(extraout_var,iVar2) != 8) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&temp,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
               ,0xa4);
    poVar3 = std::operator<<((ostream *)&temp,"Check failed: strm->Read(&header)");
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Invalid parameters file format");
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&temp);
  }
  if (header != 0xf7e58d4f05049cb7) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&temp,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
               ,0xa6);
    poVar3 = std::operator<<((ostream *)&temp,"Check failed: header == kTVMNDArrayListMagic");
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Invalid parameters file format");
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&temp);
  }
  iVar2 = (**local_1f0->_vptr_Stream)(local_1f0,&reserved,8);
  if (CONCAT44(extraout_var_00,iVar2) != 8) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&temp,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
               ,0xa8);
    poVar3 = std::operator<<((ostream *)&temp,"Check failed: strm->Read(&reserved)");
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Invalid parameters file format");
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&temp);
  }
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = dmlc::serializer::
          ComposeVectorHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Read(local_1f0,&names);
  if (!bVar1) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&temp,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
               ,0xac);
    poVar3 = std::operator<<((ostream *)&temp,"Check failed: strm->Read(&names)");
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Invalid parameters file format");
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&temp);
  }
  (**local_1f0->_vptr_Stream)(local_1f0,&sz,8);
  if (sz != (long)names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&temp,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
               ,0xb1);
    poVar3 = std::operator<<((ostream *)&temp,"Check failed: size == names.size()");
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Invalid parameters file format");
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&temp);
  }
  lVar4 = 0;
  uVar5 = sz;
  while (bVar1 = uVar5 != 0, uVar5 = uVar5 - 1, bVar1) {
    iVar2 = GetInputIndex(this,(string *)
                               ((long)&((names.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar4));
    dmlc::LogCheck_GE(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8);
    if (_check_err.str != (string *)0x0) {
      dmlc::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&temp,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
                 ,0xb5);
      poVar3 = std::operator<<((ostream *)&temp,"Check failed: ");
      poVar3 = std::operator<<(poVar3,"in_idx >= 0");
      poVar3 = std::operator<<(poVar3,(string *)_check_err.str);
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = std::operator<<(poVar3,"Found param for non-existent input: ");
      std::operator<<(poVar3,(string *)
                             ((long)&((names.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar4));
      dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&temp);
    }
    dmlc::LogCheckError::~LogCheckError(&_check_err);
    eid = (this->node_row_ptr_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start
          [(this->input_nodes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar2]];
    temp.data_ = (Container *)
                 ((long)(this->data_entry_).
                        super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->data_entry_).
                        super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3);
    dmlc::LogCheck_LT<unsigned_int,unsigned_long>((dmlc *)&_check_err,&eid,(unsigned_long *)&temp);
    if (_check_err.str != (string *)0x0) {
      dmlc::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&temp,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
                 ,0xb7);
      poVar3 = std::operator<<((ostream *)&temp,"Check failed: ");
      poVar3 = std::operator<<(poVar3,"eid < data_entry_.size()");
      poVar3 = std::operator<<(poVar3,(string *)_check_err.str);
      std::operator<<(poVar3,": ");
      dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&temp);
    }
    dmlc::LogCheckError::~LogCheckError(&_check_err);
    temp.data_ = (Container *)0x0;
    NDArray::Load(&temp,local_1f0);
    NDArray::CopyFrom((this->data_entry_).
                      super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>
                      ._M_impl.super__Vector_impl_data._M_start + eid,&temp);
    NDArray::~NDArray(&temp);
    lVar4 = lVar4 + 0x20;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&names);
  return;
}

Assistant:

void GraphRuntime::LoadParams(dmlc::Stream *strm) {
  uint64_t header, reserved;
  CHECK(strm->Read(&header))
      << "Invalid parameters file format";
  CHECK(header == kTVMNDArrayListMagic)
      << "Invalid parameters file format";
  CHECK(strm->Read(&reserved))
      << "Invalid parameters file format";

  std::vector<std::string> names;
  CHECK(strm->Read(&names))
      << "Invalid parameters file format";
  uint64_t sz;
  strm->Read(&sz);
  size_t size = static_cast<size_t>(sz);
  CHECK(size == names.size())
      << "Invalid parameters file format";
  for (size_t i = 0; i < size; ++i) {
    int in_idx = GetInputIndex(names[i]);
    CHECK_GE(in_idx, 0) << "Found param for non-existent input: " << names[i];
    uint32_t eid = this->entry_id(input_nodes_[in_idx], 0);
    CHECK_LT(eid, data_entry_.size());

    // The data_entry is allocated on device, NDArray.load always load the array into CPU.
    NDArray temp;
    temp.Load(strm);

    /* [RISCV-DLR] Write all data_entry */
#ifdef weight_dump
    size_t shape_size = 1;
    for (int64_t sz : attrs_.shape[in_idx]) {
      shape_size *= static_cast<size_t>(sz);
    }
    std::ofstream out_("./module/" + names[i], std::ios::out | std::ios::binary);
    if (!out_)
      assert(0);
    DLDataType t = tvm::runtime::String2TVMType(attrs_.dltype[in_idx]);
    size_t bits = t.bits * t.lanes;
    CHECK(bits % 8U == 0U || bits == 1U);
    size_t bytes = ((bits + 7U) / 8U) * shape_size;
    out_.write((char *)((*temp.operator->()).data), bytes);
    out_.close();
#endif
    data_entry_[eid].CopyFrom(temp);
  }
}